

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

Status uncompress(Header *header,FILE *ifp,FILE *ofp,CompType type)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  Ferror FVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined **ppuVar8;
  Status SVar9;
  char *pcVar10;
  count_int *pcVar11;
  count_int *pcVar12;
  bool bVar13;
  Byte local_55;
  uint local_54;
  
  init_garble();
  crc = 0;
  clear_flg = 0;
  offset = 0;
  size = 0;
  readsize = (long)header->complen;
  if (type == UNIX_COMPRESS) {
    read_byte(ifp);
    read_byte(ifp);
    bVar2 = read_byte(ifp);
    maxbits = (int)(bVar2 & 0x1f);
    readsize = readsize + -3;
  }
  else if (type == SQUASH) {
    maxbits = 0xd;
  }
  else if (arcfs == 0) {
    bVar2 = read_byte(ifp);
    maxbits = (int)bVar2;
    readsize = readsize + -1;
  }
  else {
    maxbits = arcfs_maxbits;
    ungarble('\0');
  }
  maxmaxcode = ~(-1 << ((byte)maxbits & 0x1f));
  n_bits = 9;
  maxcode = 0x1ff;
  memset(codetab,0,0x200);
  lVar6 = 0xff;
  do {
    *(char *)((long)htab + lVar6) = (char)lVar6;
    bVar13 = lVar6 != 0;
    lVar6 = lVar6 + -1;
  } while (bVar13);
  free_ent = 0x101;
  local_54 = getcode(ifp);
  if (local_54 != 0xffffffff) {
    if (type == CRUNCH) {
      putc_init();
      putc_ncr(ofp,(Byte)local_54);
    }
    else {
      if (testing == '\0') {
        write_byte(ofp,(Byte)local_54);
      }
      calccrc((Byte)local_54);
    }
    uVar3 = getcode(ifp);
    if (uVar3 != 0xffffffff) {
      pcVar12 = htab + 0x4000;
      local_55 = (Byte)local_54;
      do {
        FVar4 = check_stream(ifp);
        if (FVar4 != FNOERR) break;
        uVar5 = uVar3;
        if (uVar3 == 0x100) {
          memset(codetab,0,0x200);
          clear_flg = 1;
          free_ent = 0x100;
          uVar5 = getcode(ifp);
          if (uVar5 == 0xffffffff) break;
        }
        pcVar11 = pcVar12;
        uVar3 = uVar5;
        if (free_ent <= (int)uVar5) {
          *(Byte *)pcVar12 = local_55;
          pcVar11 = (count_int *)((long)pcVar12 + 1);
          uVar3 = local_54;
        }
        uVar7 = (ulong)uVar3;
        pcVar12 = pcVar11;
        if (0xff < (int)uVar3) {
          do {
            pcVar11 = (count_int *)((long)pcVar12 + 1);
            if (&free_ent < pcVar11) goto LAB_001040d2;
            *(Byte *)pcVar12 = *(Byte *)((long)htab + uVar7);
            uVar1 = codetab[uVar7];
            uVar7 = (ulong)uVar1;
            uVar3 = (uint)uVar1;
            pcVar12 = pcVar11;
          } while (0xff < uVar1);
        }
        pcVar12 = (count_int *)((long)pcVar11 + 1);
        if (&free_ent < pcVar12) {
LAB_001040d2:
          error("%s: uncompress: corrupt or garbled archive file",ourname);
          exit(1);
        }
        local_55 = *(Byte *)((long)htab + (long)(int)uVar3);
        *(Byte *)pcVar11 = local_55;
        while (htab + 0x4000 < pcVar12) {
          pcVar12 = (count_int *)((long)pcVar12 + -1);
          if (type == CRUNCH) {
            putc_ncr(ofp,*(Byte *)pcVar12);
          }
          else {
            if (testing == '\0') {
              write_byte(ofp,*(Byte *)pcVar12);
            }
            calccrc(*(Byte *)pcVar12);
          }
        }
        if (free_ent < maxmaxcode) {
          codetab[free_ent] = (unsigned_short)local_54;
          *(Byte *)((long)htab + (long)free_ent) = local_55;
          free_ent = free_ent + 1;
        }
        uVar3 = getcode(ifp);
        local_54 = uVar5;
      } while (uVar3 != 0xffffffff);
    }
  }
  FVar4 = check_stream(ifp);
  SVar9 = RERR;
  if (FVar4 != FRWERR) {
    if ((testing == '\0') && (FVar4 = check_stream(ofp), FVar4 == FRWERR)) {
      return WERR;
    }
    SVar9 = CRCERR;
    if (header->crc == (Halfword)crc) {
      if (type < 4) {
        ppuVar8 = &PTR_anon_var_dwarf_1d56_00108da8;
        if (testing == '\0') {
          ppuVar8 = &PTR_anon_var_dwarf_1da6_00108dc8;
        }
        pcVar10 = ppuVar8[type];
      }
      else {
        pcVar10 = "internal error";
      }
      SVar9 = NOERR;
      if (quiet == '\0') {
        SVar9 = NOERR;
        msg("%s",pcVar10);
      }
    }
  }
  return SVar9;
}

Assistant:

Status
uncompress(Header *header, FILE *ifp, FILE *ofp, CompType type)
{
	/* BB changed next line. stackp points to huge pointers. */
	register char_type NSHUGE *stackp;
	register code_int finchar;
	register code_int code, oldcode, incode;
	char *message;

	init_garble();

#if !defined(BB_HUGE_STATIC_ARRAYS)
	if (!htab)
		htab = (count_int NSHUGE *) farcalloc(HSIZE, sizeof(count_int));
	if (!codetab)
		codetab =
			(unsigned short NSHUGE *) farcalloc(HSIZE,
											  sizeof(unsigned short));
	if (!htab || !codetab)
	{
		error("%s: uncompress: out of memory", ourname);
		exit(1);
	}
#endif							/* ! BB_HUGE_STATIC_ARRAYS */

	crc = 0;
	clear_flg = 0;
	offset = 0;
	size = 0;
	readsize = header->complen;

	if (type == SQUASH)
		maxbits = SQUASHBITS;
	else if (type == UNIX_COMPRESS)
	{
		/* Read the unix compress header */
		read_byte(ifp);
		read_byte(ifp);
		maxbits = read_byte(ifp) & 0x1f;
		readsize -= 3;
	}
	else
	{
		if (arcfs)
		{
			maxbits = arcfs_maxbits;
			ungarble('\0'); // Need to consume one byte of password.
		}
		else
		{
			maxbits = read_byte(ifp);
			readsize--;
		}
	}
	maxmaxcode = MAXCODE(maxbits);

	/*
	 * As above, initialize the first 256 entries in the table.
	 */
	maxcode = MAXCODE(n_bits = INIT_BITS);
	for (code = 255; code >= 0; code--)
	{
		tab_prefixof(code) = 0;
		tab_suffixof(code) = (char_type) code;
	}
	free_ent = FIRST;

	finchar = oldcode = getcode(ifp);
	if (oldcode == -1)			/* EOF already? */
		goto compress_exit;		/* Get out of here */

	/* first code must be 8 bits = char */
	if (type == CRUNCH)
	{
		putc_init();
		/* BB changed next line for Borland C/C++ 4 */
		putc_ncr(ofp, (Byte) finchar);
	}
	else
	{
		/* BB changed next three lines for Borland C/C++ 4 */
		if (!testing)
			write_byte(ofp, (Byte) finchar);
		calccrc((Byte) finchar);
	}

	stackp = de_stack;

	while ((code = getcode(ifp)) != -1)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		if (code == CLEAR)
		{
			for (code = 255; code >= 0; code--)
				tab_prefixof(code) = 0;
			clear_flg = 1;
			free_ent = FIRST - 1;
			if ((code = getcode(ifp)) == -1)	/* O, untimely death! */
				break;
		}
		incode = code;
		/*
		 * Special case for KwKwK string.
		 */
		if (code >= free_ent)
		{
			/* BB changed next line for Borland C/C++ 4 */
			*stackp++ = (char_type) finchar;
			code = oldcode;
		}
		/*
		 * Generate output characters in reverse order
		 */

		while (code >= 256)
		{
			if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
			{
				error("%s: uncompress: corrupt or garbled archive file", ourname);
				exit(1);
			}
			*stackp++ = tab_suffixof(code);
			code = tab_prefixof(code);
		}
		if ((char NSHUGE *)(stackp+1) > (char NSHUGE *)(&htab[0] + HSIZE))
		{
			error("%s: uncompress: corrupt or garbled archive file", ourname);
			exit(1);
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* *stackp++ = finchar = tab_suffixof(code); */
		finchar = tab_suffixof(code);
		*stackp++ = (char_type) finchar;

		/*
		 * And put them out in forward order
		 */
		while (stackp > de_stack)
		{
			stackp--;
			if (type == CRUNCH)
				putc_ncr(ofp, *stackp);
			else
			{
				if (!testing)
					write_byte(ofp, *stackp);
				calccrc(*stackp);
			}
		}

		/*
		 * Generate the new entry.
		 */
		if ((code = free_ent) < maxmaxcode)
		{
			/* BB changed next two lines for Borland C/C++ 4 */
			tab_prefixof(code) = (unsigned short) oldcode;
			tab_suffixof(code) = (char_type) finchar;
			free_ent = code + 1;
		}
		/*
		 * Remember previous code.
		 */
		oldcode = incode;
	}
  compress_exit:
	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "OK (compressed)";
			break;
		case CRUNCH:
			message = "OK (crunched)";
			break;
		case SQUASH:
			message = "OK (squashed)";
			break;
		default:
			message = "internal error";
			break;
		}
	else
		switch (type)
		{
		case COMPRESS:
		case UNIX_COMPRESS:
			message = "uncompressed";
			break;
		case CRUNCH:
			message = "uncrunched";
			break;
		case SQUASH:
			message = "unsquashed";
			break;
		default:
			message = "internal error";
			break;
		}
	if (!quiet)
		msg("%s", message);
	return (NOERR);
}